

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlXPathObjectPtr xmlXPathCacheWrapNodeSet(xmlXPathParserContextPtr pctxt,xmlNodeSetPtr val)

{
  xmlXPathContextPtr pxVar1;
  void *pvVar2;
  xmlXPathContextCachePtr cache;
  xmlXPathContextPtr ctxt;
  xmlXPathObjectPtr ret;
  xmlNodeSetPtr val_local;
  xmlXPathParserContextPtr pctxt_local;
  
  pxVar1 = pctxt->context;
  if (((pxVar1 == (xmlXPathContextPtr)0x0) || (pxVar1->cache == (void *)0x0)) ||
     (pvVar2 = pxVar1->cache, *(long *)((long)pvVar2 + 8) == 0)) {
    pctxt_local = (xmlXPathParserContextPtr)xmlXPathWrapNodeSet(val);
    if (pctxt_local == (xmlXPathParserContextPtr)0x0) {
      xmlXPathPErrMemory(pctxt);
    }
  }
  else {
    pctxt_local = *(xmlXPathParserContextPtr *)((long)pvVar2 + 8);
    *(xmlXPathObjectPtr *)((long)pvVar2 + 8) = pctxt_local->value;
    *(int *)((long)pvVar2 + 0x18) = *(int *)((long)pvVar2 + 0x18) + -1;
    pctxt_local->value = (xmlXPathObjectPtr)0x0;
    *(undefined4 *)&pctxt_local->cur = 1;
    pctxt_local->base = (xmlChar *)val;
  }
  return (xmlXPathObjectPtr)pctxt_local;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapNodeSet(xmlXPathParserContextPtr pctxt, xmlNodeSetPtr val)
{
    xmlXPathObjectPtr ret;
    xmlXPathContextPtr ctxt = pctxt->context;

    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache =
	    (xmlXPathContextCachePtr) ctxt->cache;

	if (cache->miscObjs != NULL) {
	    ret = cache->miscObjs;
            cache->miscObjs = (void *) ret->stringval;
            cache->numMisc -= 1;
            ret->stringval = NULL;
	    ret->type = XPATH_NODESET;
	    ret->nodesetval = val;
	    return(ret);
	}
    }

    ret = xmlXPathWrapNodeSet(val);
    if (ret == NULL)
        xmlXPathPErrMemory(pctxt);
    return(ret);
}